

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint64
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,uint64_t u)

{
  size_t i;
  long lVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uchar *d;
  undefined1 auVar4 [16];
  Number n;
  uint64_t local_18;
  double local_10;
  
  auVar4._8_4_ = (int)(u >> 0x20);
  auVar4._0_8_ = u;
  auVar4._12_4_ = 0x45300000;
  local_18 = u;
  local_10 = (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)u) - 4503599627370496.0);
  uVar3 = 0xaf63bb4c8601b479;
  lVar1 = 0;
  do {
    uVar3 = (uVar3 ^ *(byte *)((long)&local_18 + lVar1)) * 0x100000001b3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  puVar2 = Stack<rapidjson::CrtAllocator>::Push<unsigned_long>(&this->stack_,1);
  *puVar2 = uVar3;
  return true;
}

Assistant:

bool Uint64(uint64_t u) { Number n; n.u.u = u; n.d = static_cast<double>(u); return WriteNumber(n); }